

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O0

void __thiscall
TEST_CommandLineArguments_setExcludeStrictNameFilterSameParameter_Test::
~TEST_CommandLineArguments_setExcludeStrictNameFilterSameParameter_Test
          (TEST_CommandLineArguments_setExcludeStrictNameFilterSameParameter_Test *this)

{
  TEST_CommandLineArguments_setExcludeStrictNameFilterSameParameter_Test *this_local;
  
  ~TEST_CommandLineArguments_setExcludeStrictNameFilterSameParameter_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST(CommandLineArguments, setExcludeStrictNameFilterSameParameter)
{
    int argc = 2;
    const char* argv[] = { "tests.exe", "-xsnname" };
    CHECK(newArgumentParser(argc, argv));
    TestFilter nameFilter("name");
    nameFilter.invertMatching();
    nameFilter.strictMatching();
    CHECK_EQUAL(nameFilter, *args->getNameFilters());
}